

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCmpNodesExt(xmlNodePtr node1,xmlNodePtr node2)

{
  bool bVar1;
  xmlNodePtr pxVar2;
  ptrdiff_t l2;
  ptrdiff_t l1;
  xmlNodePtr root;
  xmlNodePtr cur;
  xmlNodePtr miscNode2;
  xmlNodePtr miscNode1;
  uint local_30;
  int precedence2;
  int precedence1;
  int misc;
  int depth2;
  int depth1;
  xmlNodePtr node2_local;
  xmlNodePtr node1_local;
  
  bVar1 = false;
  local_30 = 0;
  miscNode1._4_4_ = 0;
  miscNode2 = (xmlNodePtr)0x0;
  cur = (xmlNodePtr)0x0;
  if ((node1 == (xmlNodePtr)0x0) || (node2 == (xmlNodePtr)0x0)) {
    return -2;
  }
  if (node1 == node2) {
    return 0;
  }
  _depth2 = node2;
  node2_local = node1;
  switch(node1->type) {
  case XML_ELEMENT_NODE:
    if (node2->type == XML_ELEMENT_NODE) {
      if (((-1 < (long)node1->content) || (-1 < (long)node2->content)) || (node1->doc != node2->doc)
         ) goto LAB_0025767f;
      if (-(long)node1->content < -(long)node2->content) {
        return 1;
      }
      if (-(long)node2->content < -(long)node1->content) {
        return -1;
      }
    }
    break;
  case XML_ATTRIBUTE_NODE:
    local_30 = 1;
    node2_local = node1->parent;
    bVar1 = true;
    miscNode2 = node1;
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    if (node1->prev == (_xmlNode *)0x0) {
      local_30 = 2;
      node2_local = node1->parent;
    }
    else {
      do {
        node2_local = node2_local->prev;
        if (node2_local->type == XML_ELEMENT_NODE) {
          local_30 = 3;
          goto LAB_00257361;
        }
      } while (node2_local->prev != (_xmlNode *)0x0);
      local_30 = 2;
      node2_local = node2_local->parent;
    }
LAB_00257361:
    if (((node2_local == (xmlNodePtr)0x0) || (node2_local->type != XML_ELEMENT_NODE)) ||
       (-1 < (long)node2_local->content)) {
      local_30 = 0;
      miscNode2 = node1;
      node2_local = node1;
    }
    else {
      bVar1 = true;
      miscNode2 = node1;
    }
    break;
  default:
    break;
  case XML_NAMESPACE_DECL:
    return 1;
  }
  switch(node2->type) {
  case XML_ELEMENT_NODE:
    break;
  case XML_ATTRIBUTE_NODE:
    miscNode1._4_4_ = 1;
    _depth2 = node2->parent;
    bVar1 = true;
    cur = node2;
    break;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    if (node2->prev == (_xmlNode *)0x0) {
      miscNode1._4_4_ = 2;
      _depth2 = node2->parent;
    }
    else {
      do {
        _depth2 = _depth2->prev;
        if (_depth2->type == XML_ELEMENT_NODE) {
          miscNode1._4_4_ = 3;
          goto LAB_00257474;
        }
      } while (_depth2->prev != (_xmlNode *)0x0);
      miscNode1._4_4_ = 2;
      _depth2 = _depth2->parent;
    }
LAB_00257474:
    if (((_depth2 == (xmlNodePtr)0x0) || (_depth2->type != XML_ELEMENT_NODE)) ||
       (-1 < (long)_depth2->content)) {
      miscNode1._4_4_ = 0;
      cur = node2;
      _depth2 = node2;
    }
    else {
      bVar1 = true;
      cur = node2;
    }
    break;
  default:
    break;
  case XML_NAMESPACE_DECL:
    return 1;
  }
  if (bVar1) {
    if (node2_local == _depth2) {
      if (local_30 != miscNode1._4_4_) {
        if (local_30 < miscNode1._4_4_) {
          return 1;
        }
        return -1;
      }
      root = cur->prev;
      while( true ) {
        if (root == (xmlNodePtr)0x0) {
          return -1;
        }
        if (root == miscNode2) break;
        if (root->type == XML_ELEMENT_NODE) {
          return -1;
        }
        root = root->prev;
      }
      return 1;
    }
    if ((miscNode1._4_4_ == 3) && (1 < local_30)) {
      for (root = node2_local->parent; root != (xmlNodePtr)0x0; root = root->parent) {
        if (root == _depth2) {
          return 1;
        }
      }
    }
    if ((local_30 == 3) && (1 < miscNode1._4_4_)) {
      for (root = _depth2->parent; root != (xmlNodePtr)0x0; root = root->parent) {
        if (root == node2_local) {
          return -1;
        }
      }
    }
  }
  if ((((node2_local->type == XML_ELEMENT_NODE) && (_depth2->type == XML_ELEMENT_NODE)) &&
      ((long)node2_local->content < 0)) &&
     (((long)_depth2->content < 0 && (node2_local->doc == _depth2->doc)))) {
    if (-(long)node2_local->content < -(long)_depth2->content) {
      return 1;
    }
    if (-(long)_depth2->content < -(long)node2_local->content) {
      return -1;
    }
  }
LAB_0025767f:
  if (node2_local == _depth2->prev) {
    node1_local._4_4_ = 1;
  }
  else if (node2_local == _depth2->next) {
    node1_local._4_4_ = -1;
  }
  else {
    precedence1 = 0;
    for (root = _depth2; pxVar2 = root, root->parent != (_xmlNode *)0x0; root = root->parent) {
      if (root->parent == node2_local) {
        return 1;
      }
      precedence1 = precedence1 + 1;
    }
    misc = 0;
    for (root = node2_local; root->parent != (_xmlNode *)0x0; root = root->parent) {
      if (root->parent == _depth2) {
        return -1;
      }
      misc = misc + 1;
    }
    if (pxVar2 == root) {
      for (; precedence1 < misc; misc = misc + -1) {
        node2_local = node2_local->parent;
      }
      for (; misc < precedence1; precedence1 = precedence1 + -1) {
        _depth2 = _depth2->parent;
      }
      do {
        if (node2_local->parent == _depth2->parent) {
          if (node2_local == _depth2->prev) {
            return 1;
          }
          if (node2_local == _depth2->next) {
            return -1;
          }
          if (((node2_local->type == XML_ELEMENT_NODE) && (_depth2->type == XML_ELEMENT_NODE)) &&
             (((long)node2_local->content < 0 &&
              (((long)_depth2->content < 0 && (node2_local->doc == _depth2->doc)))))) {
            if (-(long)node2_local->content < -(long)_depth2->content) {
              return 1;
            }
            if (-(long)_depth2->content < -(long)node2_local->content) {
              return -1;
            }
          }
          root = node2_local->next;
          while( true ) {
            if (root == (xmlNodePtr)0x0) {
              return -1;
            }
            if (root == _depth2) break;
            root = root->next;
          }
          return 1;
        }
        node2_local = node2_local->parent;
        _depth2 = _depth2->parent;
      } while ((node2_local != (_xmlNode *)0x0) && (_depth2 != (_xmlNode *)0x0));
      node1_local._4_4_ = -2;
    }
    else {
      node1_local._4_4_ = -2;
    }
  }
  return node1_local._4_4_;
}

Assistant:

static int
xmlXPathCmpNodesExt(xmlNodePtr node1, xmlNodePtr node2) {
    int depth1, depth2;
    int misc = 0, precedence1 = 0, precedence2 = 0;
    xmlNodePtr miscNode1 = NULL, miscNode2 = NULL;
    xmlNodePtr cur, root;
    ptrdiff_t l1, l2;

    if ((node1 == NULL) || (node2 == NULL))
	return(-2);

    if (node1 == node2)
	return(0);

    /*
     * a couple of optimizations which will avoid computations in most cases
     */
    switch (node1->type) {
	case XML_ELEMENT_NODE:
	    if (node2->type == XML_ELEMENT_NODE) {
		if ((0 > (ptrdiff_t) node1->content) &&
		    (0 > (ptrdiff_t) node2->content) &&
		    (node1->doc == node2->doc))
		{
		    l1 = -((ptrdiff_t) node1->content);
		    l2 = -((ptrdiff_t) node2->content);
		    if (l1 < l2)
			return(1);
		    if (l1 > l2)
			return(-1);
		} else
		    goto turtle_comparison;
	    }
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence1 = 1; /* element is owner */
	    miscNode1 = node1;
	    node1 = node1->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode1 = node1;
	    /*
	    * Find nearest element node.
	    */
	    if (node1->prev != NULL) {
		do {
		    node1 = node1->prev;
		    if (node1->type == XML_ELEMENT_NODE) {
			precedence1 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node1->prev == NULL) {
			precedence1 = 2; /* element is parent */
			/*
			* URGENT TODO: Are there any cases, where the
			* parent of such a node is not an element node?
			*/
			node1 = node1->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence1 = 2; /* element is parent */
		node1 = node1->parent;
	    }
	    if ((node1 == NULL) || (node1->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node1->content)) {
		/*
		* Fallback for whatever case.
		*/
		node1 = miscNode1;
		precedence1 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    /*
	    * TODO: why do we return 1 for namespace nodes?
	    */
	    return(1);
	default:
	    break;
    }
    switch (node2->type) {
	case XML_ELEMENT_NODE:
	    break;
	case XML_ATTRIBUTE_NODE:
	    precedence2 = 1; /* element is owner */
	    miscNode2 = node2;
	    node2 = node2->parent;
	    misc = 1;
	    break;
	case XML_TEXT_NODE:
	case XML_CDATA_SECTION_NODE:
	case XML_COMMENT_NODE:
	case XML_PI_NODE: {
	    miscNode2 = node2;
	    if (node2->prev != NULL) {
		do {
		    node2 = node2->prev;
		    if (node2->type == XML_ELEMENT_NODE) {
			precedence2 = 3; /* element in prev-sibl axis */
			break;
		    }
		    if (node2->prev == NULL) {
			precedence2 = 2; /* element is parent */
			node2 = node2->parent;
			break;
		    }
		} while (1);
	    } else {
		precedence2 = 2; /* element is parent */
		node2 = node2->parent;
	    }
	    if ((node2 == NULL) || (node2->type != XML_ELEMENT_NODE) ||
		(0 <= (ptrdiff_t) node2->content))
	    {
		node2 = miscNode2;
		precedence2 = 0;
	    } else
		misc = 1;
	}
	    break;
	case XML_NAMESPACE_DECL:
	    return(1);
	default:
	    break;
    }
    if (misc) {
	if (node1 == node2) {
	    if (precedence1 == precedence2) {
		/*
		* The ugly case; but normally there aren't many
		* adjacent non-element nodes around.
		*/
		cur = miscNode2->prev;
		while (cur != NULL) {
		    if (cur == miscNode1)
			return(1);
		    if (cur->type == XML_ELEMENT_NODE)
			return(-1);
		    cur = cur->prev;
		}
		return (-1);
	    } else {
		/*
		* Evaluate based on higher precedence wrt to the element.
		* TODO: This assumes attributes are sorted before content.
		*   Is this 100% correct?
		*/
		if (precedence1 < precedence2)
		    return(1);
		else
		    return(-1);
	    }
	}
	/*
	* Special case: One of the helper-elements is contained by the other.
	* <foo>
	*   <node2>
	*     <node1>Text-1(precedence1 == 2)</node1>
	*   </node2>
	*   Text-6(precedence2 == 3)
	* </foo>
	*/
	if ((precedence2 == 3) && (precedence1 > 1)) {
	    cur = node1->parent;
	    while (cur) {
		if (cur == node2)
		    return(1);
		cur = cur->parent;
	    }
	}
	if ((precedence1 == 3) && (precedence2 > 1)) {
	    cur = node2->parent;
	    while (cur) {
		if (cur == node1)
		    return(-1);
		cur = cur->parent;
	    }
	}
    }

    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

turtle_comparison:

    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * compute depth to root
     */
    for (depth2 = 0, cur = node2; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node1)
	    return(1);
	depth2++;
    }
    root = cur;
    for (depth1 = 0, cur = node1; cur->parent != NULL; cur = cur->parent) {
	if (cur->parent == node2)
	    return(-1);
	depth1++;
    }
    /*
     * Distinct document (or distinct entities :-( ) case.
     */
    if (root != cur) {
	return(-2);
    }
    /*
     * get the nearest common ancestor.
     */
    while (depth1 > depth2) {
	depth1--;
	node1 = node1->parent;
    }
    while (depth2 > depth1) {
	depth2--;
	node2 = node2->parent;
    }
    while (node1->parent != node2->parent) {
	node1 = node1->parent;
	node2 = node2->parent;
	/* should not happen but just in case ... */
	if ((node1 == NULL) || (node2 == NULL))
	    return(-2);
    }
    /*
     * Find who's first.
     */
    if (node1 == node2->prev)
	return(1);
    if (node1 == node2->next)
	return(-1);
    /*
     * Speedup using document order if available.
     */
    if ((node1->type == XML_ELEMENT_NODE) &&
	(node2->type == XML_ELEMENT_NODE) &&
	(0 > (ptrdiff_t) node1->content) &&
	(0 > (ptrdiff_t) node2->content) &&
	(node1->doc == node2->doc)) {

	l1 = -((ptrdiff_t) node1->content);
	l2 = -((ptrdiff_t) node2->content);
	if (l1 < l2)
	    return(1);
	if (l1 > l2)
	    return(-1);
    }

    for (cur = node1->next;cur != NULL;cur = cur->next)
	if (cur == node2)
	    return(1);
    return(-1); /* assume there is no sibling list corruption */
}